

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::Cluster::HasBlockEntries(Segment *pSegment,longlong off,longlong *pos,long *len)

{
  int iVar1;
  longlong lVar2;
  longlong lVar3;
  long local_b0;
  longlong unknown_size_1;
  longlong size_1;
  longlong id_1;
  longlong result_1;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong result;
  longlong cluster_stop;
  longlong segment_stop;
  long status;
  longlong avail;
  longlong total;
  IMkvReader *pReader;
  long *len_local;
  longlong *pos_local;
  longlong off_local;
  Segment *pSegment_local;
  
  pReader = (IMkvReader *)len;
  len_local = pos;
  pos_local = (longlong *)off;
  off_local = (longlong)pSegment;
  if (pSegment == (Segment *)0x0) {
    __assert_fail("pSegment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1ad1,
                  "static long mkvparser::Cluster::HasBlockEntries(const Segment *, long long, long long &, long &)"
                 );
  }
  if (off < 0) {
    __assert_fail("off >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1ad2,
                  "static long mkvparser::Cluster::HasBlockEntries(const Segment *, long long, long long &, long &)"
                 );
  }
  total = (longlong)pSegment->m_pReader;
  iVar1 = (*((IMkvReader *)total)->_vptr_IMkvReader[1])(total,&avail,&status);
  pSegment_local = (Segment *)(long)iVar1;
  if (-1 < (long)pSegment_local) {
    if (-1 < avail && avail < status) {
      __assert_fail("(total < 0) || (avail <= total)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1add,
                    "static long mkvparser::Cluster::HasBlockEntries(const Segment *, long long, long long &, long &)"
                   );
    }
    *len_local = *(long *)(off_local + 0x10) + (long)pos_local;
    if ((avail < 0) || (*len_local < avail)) {
      if (*(long *)(off_local + 0x18) < 0) {
        local_b0 = -1;
      }
      else {
        local_b0 = *(long *)(off_local + 0x10) + *(long *)(off_local + 0x18);
      }
      result = -1;
      if (status < *len_local + 1) {
        pReader->_vptr_IMkvReader = (_func_int **)0x1;
        pSegment_local = (Segment *)0xfffffffffffffffd;
      }
      else {
        pSegment_local = (Segment *)GetUIntLength((IMkvReader *)total,*len_local,(long *)pReader);
        if (-1 < (long)pSegment_local) {
          if ((long)pSegment_local < 1) {
            if ((local_b0 < 0) || (*len_local + (long)pReader->_vptr_IMkvReader <= local_b0)) {
              if ((avail < 0) || (*len_local + (long)pReader->_vptr_IMkvReader <= avail)) {
                if (status < *len_local + (long)pReader->_vptr_IMkvReader) {
                  pSegment_local = (Segment *)0xfffffffffffffffd;
                }
                else {
                  pSegment_local = (Segment *)ReadID((IMkvReader *)total,*len_local,(long *)pReader)
                  ;
                  if (-1 < (long)pSegment_local) {
                    if (pSegment_local == (Segment *)0x1f43b675) {
                      *len_local = (long)pReader->_vptr_IMkvReader + *len_local;
                      if (status < *len_local + 1) {
                        pReader->_vptr_IMkvReader = (_func_int **)0x1;
                        pSegment_local = (Segment *)0xfffffffffffffffd;
                      }
                      else {
                        pSegment_local =
                             (Segment *)
                             GetUIntLength((IMkvReader *)total,*len_local,(long *)pReader);
                        if (-1 < (long)pSegment_local) {
                          if ((long)pSegment_local < 1) {
                            if ((local_b0 < 0) ||
                               (*len_local + (long)pReader->_vptr_IMkvReader <= local_b0)) {
                              if ((avail < 0) ||
                                 (*len_local + (long)pReader->_vptr_IMkvReader <= avail)) {
                                if (status < *len_local + (long)pReader->_vptr_IMkvReader) {
                                  pSegment_local = (Segment *)0xfffffffffffffffd;
                                }
                                else {
                                  pSegment_local =
                                       (Segment *)
                                       ReadUInt((IMkvReader *)total,*len_local,(long *)pReader);
                                  if (-1 < (long)pSegment_local) {
                                    if (pSegment_local == (Segment *)0x0) {
                                      pSegment_local = (Segment *)0x0;
                                    }
                                    else {
                                      *len_local = (long)pReader->_vptr_IMkvReader + *len_local;
                                      if (pSegment_local !=
                                          (Segment *)
                                          ((1L << ((char)pReader->_vptr_IMkvReader * '\a' & 0x3fU))
                                          + -1)) {
                                        result = (long)&pSegment_local->m_pReader + *len_local;
                                        if (result < 0) {
                                          __assert_fail("cluster_stop >= 0",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                                  ,0x1b32,
                                                  "static long mkvparser::Cluster::HasBlockEntries(const Segment *, long long, long long &, long &)"
                                                  );
                                        }
                                        if ((-1 < local_b0) && (local_b0 < result)) {
                                          return -2;
                                        }
                                        if ((-1 < avail) && (avail < result)) {
                                          return 0;
                                        }
                                      }
                                      do {
                                        do {
                                          if ((-1 < result) && (result <= *len_local)) {
                                            return 0;
                                          }
                                          if (status < *len_local + 1) {
                                            pReader->_vptr_IMkvReader = (_func_int **)0x1;
                                            return -3;
                                          }
                                          lVar2 = GetUIntLength((IMkvReader *)total,*len_local,
                                                                (long *)pReader);
                                          if (lVar2 < 0) {
                                            return lVar2;
                                          }
                                          if (0 < lVar2) {
                                            return -3;
                                          }
                                          if ((-1 < result) &&
                                             (result < *len_local + (long)pReader->_vptr_IMkvReader)
                                             ) {
                                            return -2;
                                          }
                                          if (status < *len_local + (long)pReader->_vptr_IMkvReader)
                                          {
                                            return -3;
                                          }
                                          lVar2 = ReadID((IMkvReader *)total,*len_local,
                                                         (long *)pReader);
                                          if (lVar2 < 0) {
                                            return lVar2;
                                          }
                                          if (lVar2 == 0x1f43b675) {
                                            return 0;
                                          }
                                          if (lVar2 == 0x1c53bb6b) {
                                            return 0;
                                          }
                                          *len_local = (long)pReader->_vptr_IMkvReader + *len_local;
                                          if ((-1 < result) && (result <= *len_local)) {
                                            return -2;
                                          }
                                          if (status < *len_local + 1) {
                                            pReader->_vptr_IMkvReader = (_func_int **)0x1;
                                            return -3;
                                          }
                                          lVar3 = GetUIntLength((IMkvReader *)total,*len_local,
                                                                (long *)pReader);
                                          if (lVar3 < 0) {
                                            return lVar3;
                                          }
                                          if (0 < lVar3) {
                                            return -3;
                                          }
                                          if ((-1 < result) &&
                                             (result < *len_local + (long)pReader->_vptr_IMkvReader)
                                             ) {
                                            return -2;
                                          }
                                          if (status < *len_local + (long)pReader->_vptr_IMkvReader)
                                          {
                                            return -3;
                                          }
                                          lVar3 = ReadUInt((IMkvReader *)total,*len_local,
                                                           (long *)pReader);
                                          if (lVar3 < 0) {
                                            return lVar3;
                                          }
                                          *len_local = (long)pReader->_vptr_IMkvReader + *len_local;
                                          if ((-1 < result) && (result < *len_local)) {
                                            return -2;
                                          }
                                        } while (lVar3 == 0);
                                        if (lVar3 == (1L << ((char)pReader->_vptr_IMkvReader * '\a'
                                                            & 0x3fU)) + -1) {
                                          return -2;
                                        }
                                        if ((-1 < result) && (result < lVar3 + *len_local)) {
                                          return -2;
                                        }
                                        if (lVar2 == 0xa0) {
                                          return 1;
                                        }
                                        if (lVar2 == 0xa3) {
                                          return 1;
                                        }
                                        *len_local = lVar3 + *len_local;
                                      } while ((result < 0) || (*len_local <= result));
                                      pSegment_local = (Segment *)0xfffffffffffffffe;
                                    }
                                  }
                                }
                              }
                              else {
                                pSegment_local = (Segment *)0x0;
                              }
                            }
                            else {
                              pSegment_local = (Segment *)0xfffffffffffffffe;
                            }
                          }
                          else {
                            pSegment_local = (Segment *)0xfffffffffffffffd;
                          }
                        }
                      }
                    }
                    else {
                      pSegment_local = (Segment *)0xffffffffffffffff;
                    }
                  }
                }
              }
              else {
                pSegment_local = (Segment *)0x0;
              }
            }
            else {
              pSegment_local = (Segment *)0xfffffffffffffffe;
            }
          }
          else {
            pSegment_local = (Segment *)0xfffffffffffffffd;
          }
        }
      }
    }
    else {
      pSegment_local = (Segment *)0x0;
    }
  }
  return (long)pSegment_local;
}

Assistant:

long Cluster::HasBlockEntries(
    const Segment* pSegment,
    long long off,  // relative to start of segment payload
    long long& pos, long& len) {
  assert(pSegment);
  assert(off >= 0);  // relative to segment

  IMkvReader* const pReader = pSegment->m_pReader;

  long long total, avail;

  long status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  pos = pSegment->m_start + off;  // absolute

  if ((total >= 0) && (pos >= total))
    return 0;  // we don't even have a complete cluster

  const long long segment_stop =
      (pSegment->m_size < 0) ? -1 : pSegment->m_start + pSegment->m_size;

  long long cluster_stop = -1;  // interpreted later to mean "unknown size"

  {
    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // need more data
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + len) > total))
      return 0;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id != libwebm::kMkvCluster)
      return E_PARSE_FAILED;

    pos += len;  // consume Cluster ID field

    // read size field

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + len) > total))
      return 0;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    if (size == 0)
      return 0;  // cluster does not have entries

    pos += len;  // consume size field

    // pos now points to start of payload

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size != unknown_size) {
      cluster_stop = pos + size;
      assert(cluster_stop >= 0);

      if ((segment_stop >= 0) && (cluster_stop > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((total >= 0) && (cluster_stop > total))
        // return E_FILE_FORMAT_INVALID;  //too conservative
        return 0;  // cluster does not have any entries
    }
  }

  for (;;) {
    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      return 0;  // no entries detected

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // need more data
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    // This is the distinguished set of ID's we use to determine
    // that we have exhausted the sub-element's inside the cluster
    // whose ID we parsed earlier.

    if (id == libwebm::kMkvCluster)
      return 0;  // no entries found

    if (id == libwebm::kMkvCues)
      return 0;  // no entries found

    pos += len;  // consume id field

    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      return E_FILE_FORMAT_INVALID;

    // read size field

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // underflow
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume size field

    // pos now points to start of payload

    if ((cluster_stop >= 0) && (pos > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;  // not supported inside cluster

    if ((cluster_stop >= 0) && ((pos + size) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvBlockGroup)
      return 1;  // have at least one entry

    if (id == libwebm::kMkvSimpleBlock)
      return 1;  // have at least one entry

    pos += size;  // consume payload
    if (cluster_stop >= 0 && pos > cluster_stop)
      return E_FILE_FORMAT_INVALID;
  }
}